

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxMainSM(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,TYPE ttype)

{
  ulong *puVar1;
  undefined8 *in_RDI;
  Real in_stack_ffffffffffffff10;
  undefined8 *puVar2;
  undefined8 in_stack_ffffffffffffff18;
  int n;
  undefined8 *val;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *in_stack_ffffffffffffff20;
  cpp_dec_float<100U,_int,_void> *this_00;
  undefined8 in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff50;
  ulong local_70;
  ulong local_68 [5];
  undefined8 local_40;
  ulong *local_38;
  undefined8 *local_30;
  undefined8 local_28;
  ulong *local_20;
  undefined8 *local_18;
  ulong *local_10;
  ulong *local_8;
  
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSimplifier(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                  (TYPE)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  *in_RDI = &PTR__SPxMainSM_0089cdd0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x4ab109);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x4ab121);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x4ab139);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x4ab151);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray(in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
              (int)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray(in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
              (int)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  DataArray<int>::DataArray
            ((DataArray<int> *)in_stack_ffffffffffffff20,
             (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff10);
  DataArray<int>::DataArray
            ((DataArray<int> *)in_stack_ffffffffffffff20,
             (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff10);
  n = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  ::Array((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
           *)in_stack_ffffffffffffff20,n);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           *)in_stack_ffffffffffffff20,n);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           *)in_stack_ffffffffffffff20,n);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           *)in_stack_ffffffffffffff20,n);
  this_00 = (cpp_dec_float<100U,_int,_void> *)(in_RDI + 0x42);
  Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::Array((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           *)this_00,n);
  *(undefined1 *)(in_RDI + 0x45) = 0;
  val = in_RDI + 0x46;
  DataArray<int>::DataArray
            ((DataArray<int> *)this_00,(int)((ulong)val >> 0x20),(int)val,in_stack_ffffffffffffff10)
  ;
  *(undefined4 *)(in_RDI + 0x49) = 1;
  *(undefined1 *)((long)in_RDI + 0x24c) = 0;
  *(undefined4 *)(in_RDI + 0x4a) = 0;
  *(undefined4 *)((long)in_RDI + 0x254) = 0;
  puVar2 = in_RDI + 0x4b;
  puVar1 = (ulong *)infinity();
  local_68[0] = *puVar1 ^ 0x8000000000000000;
  local_38 = local_68;
  local_40 = 0;
  local_30 = puVar2;
  local_8 = local_38;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (this_00,(double)val,puVar2);
  puVar1 = (ulong *)infinity();
  local_70 = *puVar1 ^ 0x8000000000000000;
  local_20 = &local_70;
  local_28 = 0;
  local_18 = in_RDI + 0x55;
  local_10 = local_20;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (this_00,(double)val,puVar2);
  return;
}

Assistant:

SPxMainSM(Timer::TYPE ttype = Timer::USER_TIME)
      : SPxSimplifier<R>("MainSM", ttype)
      , m_postsolved(0)
      , m_stat(16)
      , m_thesense(SPxLPBase<R>::MAXIMIZE)
      , m_keepbounds(false)
      , m_addedcols(0)
      , m_result(this->OKAY)
      , m_cutoffbound(R(-infinity))
      , m_pseudoobj(R(-infinity))
   {}